

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::StructUnionTypeSyntax::getChild(StructUnionTypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff48;
  TokenOrSyntax *in_stack_ffffffffffffff50;
  nullptr_t in_stack_ffffffffffffff58;
  Info *in_stack_ffffffffffffff60;
  
  switch(in_RDX) {
  case 0:
    token.info = in_stack_ffffffffffffff60;
    token._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token);
    break;
  case 1:
    token_00.info = in_stack_ffffffffffffff60;
    token_00._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_00);
    break;
  case 2:
    token_01.info = in_stack_ffffffffffffff60;
    token_01._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_01);
    break;
  case 3:
    token_02.info = in_stack_ffffffffffffff60;
    token_02._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_02);
    break;
  case 4:
    token_03.info = in_stack_ffffffffffffff60;
    token_03._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_03);
    break;
  case 5:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    break;
  case 6:
    token_04.info = in_stack_ffffffffffffff60;
    token_04._0_8_ = in_stack_ffffffffffffff58;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff50,token_04);
    break;
  case 7:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0xb0),in_stack_ffffffffffffff48);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax StructUnionTypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return taggedOrSoft;
        case 2: return packed;
        case 3: return signing;
        case 4: return openBrace;
        case 5: return &members;
        case 6: return closeBrace;
        case 7: return &dimensions;
        default: return nullptr;
    }
}